

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O0

void __thiscall
DListBase<Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::
RemoveHead<Memory::NoThrowHeapAllocator>
          (DListBase<Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *this,
          NoThrowHeapAllocator *allocator)

{
  DListNode<Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>_> *obj;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  DListNodeBase<Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>_> **ppDVar4;
  NodeBase *node;
  NoThrowHeapAllocator *allocator_local;
  DListBase<Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *this_local;
  
  bVar2 = Empty(this);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                       ,0x158,"(!this->Empty())","!this->Empty()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  ppDVar4 = DListNodeBase<Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>_>::Next
                      (&this->
                        super_DListNodeBase<Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
                      );
  obj = (DListNode<Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>_> *)*ppDVar4;
  RemoveNode((NodeBase *)obj);
  Memory::
  DeleteObject<Memory::NoThrowHeapAllocator,(Memory::AllocatorDeleteFlags)0,DListNode<Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>>>
            (allocator,obj);
  RealCount::DecrementCount(&this->super_RealCount);
  return;
}

Assistant:

void RemoveHead(TAllocator * allocator)
    {
        Assert(!this->Empty());

        NodeBase * node = this->Next();
        DListBase::RemoveNode(node);
        AllocatorDelete(TAllocator, allocator, (Node *)node);

        this->DecrementCount();
    }